

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

int __thiscall
CVmObjHTTPRequest::getp_endChunkedReply
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  TadsHttpRequest *this_00;
  TadsHttpServerThread *this_01;
  int iVar1;
  ssize_t sVar2;
  uint *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  int in_R8D;
  vm_val_t *this_02;
  
  if (oargc == (uint *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *oargc;
  }
  __n = oargc;
  if (getp_endChunkedReply(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_endChunkedReply(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar1 != 0) {
      getp_endChunkedReply::desc.min_argc_ = 0;
      getp_endChunkedReply::desc.opt_argc_ = 1;
      getp_endChunkedReply::desc.varargs_ = 0;
      __cxa_guard_release(&getp_endChunkedReply(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_endChunkedReply::desc);
  if (iVar1 == 0) {
    this_00 = *(TadsHttpRequest **)(this->super_CVmObject).ext_;
    this_01 = this_00->thread;
    pvVar3 = extraout_RDX;
    if ((this_00->super_TadsEventMessage).super_TadsMessage.completed != 0) {
      throw_net_err("request already completed",0);
      pvVar3 = extraout_RDX_00;
    }
    sVar2 = TadsServerThread::send
                      (&this_01->super_TadsServerThread,0x2b4d93,pvVar3,(size_t)__n,in_R8D);
    pvVar3 = extraout_RDX_01;
    if ((int)sVar2 == 0) {
      throw_net_err("error sending end-of-stream",
                    (((this_01->super_TadsServerThread).socket)->super_OS_CoreSocket).err);
      pvVar3 = extraout_RDX_02;
    }
    if (uVar4 != 0) {
      this_02 = sp_ + -1;
      iVar1 = vm_val_t::is_listlike(this_02);
      if (iVar1 == 0) {
        err_throw(0x7e4);
      }
      send_custom_headers(&this_01->super_TadsServerThread,this_02);
      pvVar3 = extraout_RDX_03;
    }
    sVar2 = TadsServerThread::send
                      (&this_01->super_TadsServerThread,0x2b4d59,pvVar3,(size_t)__n,in_R8D);
    if ((int)sVar2 == 0) {
      throw_net_err("error sending suffix",
                    (((this_01->super_TadsServerThread).socket)->super_OS_CoreSocket).err);
    }
    TadsHttpRequest::complete(this_00);
    sp_ = sp_ + -(long)(int)uVar4;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_endChunkedReply(VMG_ vm_obj_id_t self,
                                            vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the request and the thread */
    TadsHttpRequest *req = get_ext()->req;
    TadsServerThread *t = req->thread;

    /* if the request is already completed, this is an error */
    if (req->completed)
        throw_net_err(vmg_ "request already completed", 0);

    /* send the "0" length prefix to indicate we're done */
    if (!t->send("0\r\n"))
        throw_net_err(vmg_ "error sending end-of-stream", t->last_error());

    /* get the headers argument */
    const vm_val_t *headers = 0;
    if (argc >= 1)
    {
        /* get the headers value */
        headers = G_stk->get(0);

        /* make sure it's a list */
        if (!headers->is_listlike(vmg0_))
            err_throw(VMERR_LIST_VAL_REQD);

        /* send the headers */
        send_custom_headers(vmg_ t, headers);
    }

    /* send the closing CR-LF */
    if (!t->send("\r\n"))
        throw_net_err(vmg_ "error sending suffix", t->last_error());

    /* mark the request as completed */
    req->complete();

    /* discard arguments */
    G_stk->discard(argc);

    /* no result */
    retval->set_nil();

    /* handled */
    return TRUE;
}